

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O3

void __thiscall APITests::test_pwm_change_duty_cycle(APITests *this)

{
  PWM p;
  PWM local_10 [8];
  
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).out_a,OUT,1);
  GPIO::PWM::PWM(local_10,(this->pin_data).out_a,500);
  GPIO::PWM::start(50.0);
  GPIO::PWM::ChangeDutyCycle(60.0);
  GPIO::PWM::stop();
  GPIO::cleanup();
  GPIO::PWM::~PWM(local_10);
  return;
}

Assistant:

void test_pwm_change_duty_cycle()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);
        GPIO::PWM p(pin_data.out_a, 500);
        p.start(50.0);
        p.ChangeDutyCycle(60.0);
        p.stop();
        GPIO::cleanup();
    }